

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  mz_uint64 *pmVar1;
  char *user_extra_data_00;
  tdefl_compressor *d;
  mz_uint64 mVar2;
  mz_uint16 extra_size;
  mz_bool mVar3;
  mz_uint mVar4;
  uint uVar5;
  tdefl_status tVar6;
  time_t *ptVar8;
  size_t sVar9;
  mz_uint64 *pmVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  sbyte sVar14;
  ushort uVar15;
  mz_uint64 *pmVar16;
  mz_uint64 *pmVar17;
  long lVar18;
  ulong uVar19;
  mz_uint8 *pmVar20;
  byte bVar21;
  bool bVar22;
  sbyte sVar23;
  undefined6 in_register_0000008a;
  undefined1 uVar24;
  undefined1 uVar25;
  mz_uint8 *pmVar26;
  uint level;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint8 *local_118;
  char *local_110;
  ulong local_108;
  mz_uint64 comp_size;
  tdefl_compressor *local_f8;
  size_t local_f0;
  ulong local_e8;
  mz_uint64 local_dir_header_ofs;
  mz_zip_writer_add_state state;
  mz_uint16 local_bc;
  mz_uint16 local_b8;
  time_t cur_time;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined2 uStack_9a;
  undefined6 uStack_98;
  long lStack_92;
  ulong local_88;
  ulong local_80;
  mz_uint8 *local_78;
  undefined8 local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  mz_uint32 mVar7;
  
  local_108 = CONCAT44(local_108._4_4_,(int)CONCAT62(in_register_0000008a,comment_size));
  dos_time = 0;
  dos_date = 0;
  local_118 = (mz_uint8 *)pZip->m_archive_size;
  comp_size = 0;
  uVar5 = 6;
  if (-1 < (int)level_and_flags) {
    uVar5 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar15 = (ushort)((uVar5 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar15 = 8;
  }
  if ((uVar5 >> 0x10 & 1) == 0) {
    uVar15 = uVar15 + 0x800;
  }
  level = uVar5 & 0xf;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_00156555:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < level)))) goto LAB_00156555;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && (uVar5 & 0x400) == 0) goto LAB_00156555;
  local_110 = pArchive_name;
  local_f0 = buf_size;
  local_dir_header_ofs = (mz_uint64)local_118;
  local_78 = (mz_uint8 *)pBuf;
  local_60 = pComment;
  mVar3 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar3 == 0) {
LAB_00156648:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  ptVar8 = last_modified;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar8 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar8,&dos_time,&dos_date);
  sVar11 = local_f0;
  if ((uVar5 & 0x400) == 0) {
    local_80 = mz_crc32(0,local_78,local_f0);
    uncomp_size = sVar11;
    if (sVar11 < 4) {
      level = 0;
    }
    bVar22 = sVar11 < 4 || ((uVar5 & 0xf) == 0 || (uVar5 & 0x400) != 0);
  }
  else {
    local_80 = (ulong)uncomp_crc32;
    bVar22 = true;
  }
  sVar9 = strlen(local_110);
  if (0xffff < sVar9) goto LAB_00156648;
  mVar4 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  sVar11 = (pArray->m_central_dir).m_size;
  local_68 = local_108 & 0xffff;
  if (0xfffffffe < sVar11 + local_68 + sVar9 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar18 = 0x1c;
  local_e8 = CONCAT44(local_e8._4_4_,mVar4);
  uVar13 = (ulong)mVar4;
  local_88 = (ulong)user_extra_data_len;
  if (pArray->m_zip64 == 0) {
    if ((pZip->m_archive_size +
        (ulong)user_extra_data_central_len + local_68 + local_88 + sVar9 * 2 + uVar13 + sVar11) -
        0xffffff8e < 0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar18 = 0;
    }
  }
  local_70 = 0;
  if ((sVar9 != 0) && (local_110[sVar9 - 1] == '/')) {
    if (uncomp_size != 0 || local_f0 != 0) goto LAB_00156555;
    local_70 = 0x10;
  }
  uVar19 = lVar18 + local_68 + sVar9 + sVar11 + 0x2e;
  local_108 = sVar9;
  if ((((pArray->m_central_dir).m_capacity < uVar19) &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,1), mVar3 == 0)) ||
     ((uVar19 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar19 &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar19,1),
      mVar3 == 0)))) {
LAB_001568f4:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (local_f0 == 0 || bVar22 != false) {
    local_f8 = (tdefl_compressor *)0x0;
  }
  else {
    local_f8 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_f8 == (tdefl_compressor *)0x0) goto LAB_001568f4;
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_118,(mz_uint32)local_e8);
  uVar19 = local_108;
  if (mVar3 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar13;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                  ,0x1807,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  pmVar20 = local_118 + uVar13;
  uStack_98 = 0;
  lStack_92 = 0;
  cur_time = 0;
  uStack_a0 = 0;
  uStack_9f = 0;
  uStack_9e = 0;
  uStack_9d = 0;
  uStack_9c = 0;
  uStack_9b = 0;
  uStack_9a = 0;
  bVar21 = bVar22 ^ 1U | (uVar5 & 0x400) != 0;
  local_e8 = (ulong)uVar15;
  uVar24 = (undefined1)((ushort)bVar21 << 3);
  if (pArray->m_zip64 == 0) {
    if ((ulong)pmVar20 >> 0x20 != 0 || comp_size._4_4_ != 0) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    uVar25 = 0x14;
    if (bVar21 == 0) {
      uVar25 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar25,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)uVar15,(uint6)cur_time);
    cur_time = CONCAT17((char)(uVar15 >> 8),(undefined7)cur_time);
    uStack_9e = (undefined1)dos_time;
    local_b8 = dos_time;
    uStack_9d = (undefined1)(dos_time >> 8);
    local_bc = dos_date;
    uStack_9c = (undefined1)dos_date;
    uStack_9b = (undefined1)(dos_date >> 8);
    uStack_9a = 0;
    uStack_98 = 0;
    lStack_92 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_108)) << 0x20;
    uStack_a0 = uVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) {
LAB_00156d57:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)(pmVar20 + 0x1e),local_110,uVar19);
    if (sVar11 != uVar19) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
      goto LAB_00156d57;
    }
    pmVar26 = pmVar20 + 0x1e + uVar19;
    pmVar20 = (mz_uint8 *)0x0;
    uVar5 = 0;
LAB_00156b55:
    uVar13 = local_88;
    extra_size = (mz_uint16)uVar5;
    if (user_extra_data_len != 0) {
      sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar26,user_extra_data,local_88);
      if (sVar11 != uVar13) {
LAB_00156bca:
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      pmVar26 = pmVar26 + uVar13;
    }
    sVar11 = local_f0;
    local_118 = pmVar20;
    if (bVar22 == false) {
      mVar2 = comp_size;
      if (local_f0 != 0) {
        state.m_comp_size = 0;
        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = (mz_uint64)pmVar26;
        mVar4 = tdefl_create_comp_flags_from_zip_params(level,-0xf,0);
        d = local_f8;
        tdefl_init(local_f8,mz_zip_writer_add_put_buf_callback,&state,mVar4);
        tVar6 = tdefl_compress_buffer(d,local_78,local_f0,TDEFL_FINISH);
        pmVar26 = (mz_uint8 *)state.m_cur_archive_file_ofs;
        mVar2 = state.m_comp_size;
        if (tVar6 != TDEFL_STATUS_DONE) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
          pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
          return 0;
        }
      }
LAB_00156c54:
      comp_size = mVar2;
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
      if (uncomp_size == 0) {
        uVar13 = 0;
      }
      else {
        if ((local_e8 & 8) == 0) {
          __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x1874,
                        "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                       );
        }
        state.m_pZip = (mz_zip_archive *)
                       CONCAT17((char)(local_80 >> 0x18),
                                CONCAT16((char)(local_80 >> 0x10),
                                         CONCAT15((char)(local_80 >> 8),
                                                  CONCAT14((char)local_80,0x8074b50))));
        uVar24 = (undefined1)uncomp_size;
        if (local_118 == (mz_uint8 *)0x0) {
          if (comp_size >> 0x20 != 0) {
            pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
            return 0;
          }
          pmVar10 = &state.m_cur_archive_file_ofs;
          pmVar16 = &state.m_cur_archive_file_ofs;
          pmVar17 = &state.m_cur_archive_file_ofs;
          state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size)
          ;
          sVar23 = 0x18;
          sVar11 = 0x10;
          sVar14 = 8;
          pmVar1 = &state.m_cur_archive_file_ofs;
          sVar12 = sVar11;
        }
        else {
          pmVar10 = &state.m_comp_size;
          pmVar16 = &state.m_comp_size;
          pmVar17 = &state.m_comp_size;
          state.m_cur_archive_file_ofs = comp_size;
          state.m_comp_size._0_4_ = (undefined4)uncomp_size;
          pmVar1 = &state.m_comp_size;
          uVar24 = (undefined1)(uncomp_size >> 0x20);
          sVar23 = 0x38;
          sVar11 = 0x30;
          sVar14 = 0x28;
          sVar12 = 0x18;
        }
        *(undefined1 *)((long)pmVar1 + 4) = uVar24;
        *(char *)((long)pmVar17 + 5) = (char)(uncomp_size >> sVar14);
        *(char *)((long)pmVar16 + 6) = (char)(uncomp_size >> (sbyte)sVar11);
        *(char *)((long)pmVar10 + 7) = (char)(uncomp_size >> sVar23);
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar26,&state,sVar12);
        if (sVar11 != sVar12) {
          return 0;
        }
        pmVar26 = pmVar26 + sVar12;
        uVar13 = uncomp_size;
      }
      user_extra_data_00 = user_extra_data_central;
      if (local_118 != (mz_uint8 *)0x0) {
        pmVar10 = (mz_uint64 *)0x0;
        if (0xfffffffe < uVar13) {
          pmVar10 = &uncomp_size;
        }
        pmVar16 = &comp_size;
        if (uVar13 < 0xffffffff) {
          pmVar16 = (mz_uint64 *)0x0;
        }
        pmVar17 = (mz_uint64 *)0x0;
        if (0xfffffffe < local_dir_header_ofs) {
          pmVar17 = &local_dir_header_ofs;
        }
        mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar10,pmVar16,pmVar17);
        extra_size = (mz_uint16)mVar7;
        uVar13 = uncomp_size;
      }
      mVar3 = mz_zip_writer_add_to_central_dir
                        (pZip,local_110,(mz_uint16)local_108,local_118,extra_size,local_60,
                         (mz_uint16)local_68,uVar13,comp_size,(mz_uint32)local_80,
                         (ushort)bVar21 << 3,(mz_uint16)local_e8,local_b8,local_bc,
                         local_dir_header_ofs,(mz_uint32)local_70,user_extra_data_00,
                         user_extra_data_central_len);
      if (mVar3 == 0) {
        return 0;
      }
      pZip->m_total_files = pZip->m_total_files + 1;
      pZip->m_archive_size = (mz_uint64)pmVar26;
      return 1;
    }
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar26,local_78,local_f0);
    if (sVar12 == sVar11) {
      pmVar26 = pmVar26 + local_f0;
      mVar2 = local_f0;
      goto LAB_00156c54;
    }
  }
  else {
    local_118 = pmVar20;
    if (local_dir_header_ofs < 0xffffffff && uncomp_size < 0xffffffff) {
      pmVar20 = (mz_uint8 *)0x0;
      uVar5 = 0;
    }
    else {
      pmVar16 = (mz_uint64 *)0x0;
      pmVar10 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar10 = pmVar16;
      }
      pmVar17 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar17 = pmVar16;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar16 = &local_dir_header_ofs;
      }
      pmVar20 = extra_data;
      uVar5 = mz_zip_writer_create_zip64_extra_data(pmVar20,pmVar10,pmVar17,pmVar16);
    }
    uVar13 = local_108;
    uVar25 = 0x14;
    if (bVar21 == 0) {
      uVar25 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar25,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)local_e8,(uint6)cur_time);
    cur_time = CONCAT17((char)(local_e8 >> 8),(undefined7)cur_time);
    uStack_9f = 0;
    uStack_9e = (undefined1)dos_time;
    local_b8 = dos_time;
    uStack_9d = (undefined1)(dos_time >> 8);
    local_bc = dos_date;
    uStack_9c = (undefined1)dos_date;
    uStack_9b = (undefined1)(dos_date >> 8);
    uStack_9a = 0;
    uStack_98 = 0;
    lStack_92 = (ulong)CONCAT13((char)(uVar5 + user_extra_data_len >> 8),
                                CONCAT12((char)(uVar5 + user_extra_data_len),(short)local_108)) <<
                0x20;
    uStack_a0 = uVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) goto LAB_00156d74;
    pmVar26 = local_118 + 0x1e;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar26,local_110,uVar13);
    if (sVar11 == uVar13) {
      pmVar26 = pmVar26 + uVar13;
      if (pmVar20 == (mz_uint8 *)0x0) {
        pmVar20 = (mz_uint8 *)0x0;
      }
      else {
        uVar13 = (ulong)uVar5;
        sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)pmVar26,extra_data,uVar13);
        if (sVar11 != uVar13) goto LAB_00156bca;
        pmVar26 = pmVar26 + uVar13;
      }
      goto LAB_00156b55;
    }
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_f8);
LAB_00156d74:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

	if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
	{
		uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
		uncomp_size = buf_size;
		if (uncomp_size <= 3)
		{
			level = 0;
			store_data_uncompressed = MZ_TRUE;
		}
	}

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size 
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len + 
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_OBJ(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

	if (user_extra_data_len > 0)
	{
		if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
			return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

		cur_archive_file_ofs += user_extra_data_len;
	}

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}